

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MagneticField.cpp
# Opt level: O2

void __thiscall OpenMD::MagneticField::initialize(MagneticField *this)

{
  vector<double,_std::allocator<double>_> mf;
  _Vector_base<double,_std::allocator<double>_> local_48;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->simParams->MagneticField).super_ParameterBase.empty_ == false) {
    this->doMagneticField = true;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_30,
               &(this->simParams->MagneticField).data_);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&local_48,&local_30);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  }
  if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start != 0x18) {
    snprintf(painCave.errMsg,2000,
             "MagneticField: Incorrect number of parameters specified.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,(long)local_48._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
    painCave.isFatal = 1;
    simError();
  }
  (this->MF).super_Vector<double,_3U>.data_[0] = *local_48._M_impl.super__Vector_impl_data._M_start;
  (this->MF).super_Vector<double,_3U>.data_[1] =
       local_48._M_impl.super__Vector_impl_data._M_start[1];
  (this->MF).super_Vector<double,_3U>.data_[2] =
       local_48._M_impl.super__Vector_impl_data._M_start[2];
  this->initialized = true;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void MagneticField::initialize() {
    std::vector<RealType> mf;

    if (simParams->haveMagneticField()) {
      doMagneticField = true;
      mf              = simParams->getMagneticField();
    }
    if (mf.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MagneticField: Incorrect number of parameters specified.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               mf.size());
      painCave.isFatal = 1;
      simError();
    }
    MF.x() = mf[0];
    MF.y() = mf[1];
    MF.z() = mf[2];

    initialized = true;
  }